

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcreateapproxspace.cpp
# Opt level: O1

void __thiscall
TPZCreateApproximationSpace::SetAllCreateFunctionsHCurl
          (TPZCreateApproximationSpace *this,int dimension)

{
  _func_TPZCompEl_ptr__Any_data_ptr_TPZGeoEl_ptr_ptr_TPZCompMesh_ptr *__tmp_2;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp_1;
  _Any_data __tmp;
  _Any_data local_48;
  _Manager_type local_38;
  _Invoker_type p_Stack_30;
  HCurlFamily local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  this->fStyle = EHCurl;
  if (dimension == 3) {
    std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
              ((function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)> *)this->fp,CreateNoElement);
    std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
              ((function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)> *)(this->fp + 1),CreateNoElement);
    local_28 = this->fhcurlfam;
    uStack_24 = 0;
    uStack_20 = 0;
    uStack_1c = 0;
    local_48._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&this->fp[2].super__Function_base._M_functor;
    local_48._8_8_ = *(undefined8 *)((long)&this->fp[2].super__Function_base._M_functor + 8);
    *(HCurlFamily *)&this->fp[2].super__Function_base._M_functor = local_28;
    *(undefined4 *)((long)&this->fp[2].super__Function_base._M_functor + 4) = 0;
    *(undefined4 *)((long)&this->fp[2].super__Function_base._M_functor + 8) = 0;
    *(undefined4 *)((long)&this->fp[2].super__Function_base._M_functor + 0xc) = 0;
    local_38 = this->fp[2].super__Function_base._M_manager;
    this->fp[2].super__Function_base._M_manager =
         std::
         _Function_handler<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzcreateapproxspace.cpp:564:25)>
         ::_M_manager;
    p_Stack_30 = this->fp[2]._M_invoker;
    this->fp[2]._M_invoker =
         std::
         _Function_handler<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzcreateapproxspace.cpp:564:25)>
         ::_M_invoke;
    if (local_38 != (_Manager_type)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
    local_28 = this->fhcurlfam;
    uStack_24 = 0;
    uStack_20 = 0;
    uStack_1c = 0;
    local_48._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&this->fp[3].super__Function_base._M_functor;
    local_48._8_8_ = *(undefined8 *)((long)&this->fp[3].super__Function_base._M_functor + 8);
    *(HCurlFamily *)&this->fp[3].super__Function_base._M_functor = local_28;
    *(undefined4 *)((long)&this->fp[3].super__Function_base._M_functor + 4) = 0;
    *(undefined4 *)((long)&this->fp[3].super__Function_base._M_functor + 8) = 0;
    *(undefined4 *)((long)&this->fp[3].super__Function_base._M_functor + 0xc) = 0;
    local_38 = this->fp[3].super__Function_base._M_manager;
    this->fp[3].super__Function_base._M_manager =
         std::
         _Function_handler<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzcreateapproxspace.cpp:565:30)>
         ::_M_manager;
    p_Stack_30 = this->fp[3]._M_invoker;
    this->fp[3]._M_invoker =
         std::
         _Function_handler<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzcreateapproxspace.cpp:565:30)>
         ::_M_invoke;
    if (local_38 != (_Manager_type)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
    local_28 = this->fhcurlfam;
    uStack_24 = 0;
    uStack_20 = 0;
    uStack_1c = 0;
    local_48._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&this->fp[4].super__Function_base._M_functor;
    local_48._8_8_ = *(undefined8 *)((long)&this->fp[4].super__Function_base._M_functor + 8);
    *(HCurlFamily *)&this->fp[4].super__Function_base._M_functor = local_28;
    *(undefined4 *)((long)&this->fp[4].super__Function_base._M_functor + 4) = 0;
    *(undefined4 *)((long)&this->fp[4].super__Function_base._M_functor + 8) = 0;
    *(undefined4 *)((long)&this->fp[4].super__Function_base._M_functor + 0xc) = 0;
    local_38 = this->fp[4].super__Function_base._M_manager;
    this->fp[4].super__Function_base._M_manager =
         std::
         _Function_handler<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzcreateapproxspace.cpp:566:26)>
         ::_M_manager;
    p_Stack_30 = this->fp[4]._M_invoker;
    this->fp[4]._M_invoker =
         std::
         _Function_handler<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzcreateapproxspace.cpp:566:26)>
         ::_M_invoke;
    if (local_38 != (_Manager_type)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
    std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
              ((function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)> *)(this->fp + 5),CreateHCurlPyramEl);
    local_28 = this->fhcurlfam;
    uStack_24 = 0;
    uStack_20 = 0;
    uStack_1c = 0;
    local_48._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&this->fp[6].super__Function_base._M_functor;
    local_48._8_8_ = *(undefined8 *)((long)&this->fp[6].super__Function_base._M_functor + 8);
    *(HCurlFamily *)&this->fp[6].super__Function_base._M_functor = local_28;
    *(undefined4 *)((long)&this->fp[6].super__Function_base._M_functor + 4) = 0;
    *(undefined4 *)((long)&this->fp[6].super__Function_base._M_functor + 8) = 0;
    *(undefined4 *)((long)&this->fp[6].super__Function_base._M_functor + 0xc) = 0;
    local_38 = this->fp[6].super__Function_base._M_manager;
    this->fp[6].super__Function_base._M_manager =
         std::
         _Function_handler<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzcreateapproxspace.cpp:568:23)>
         ::_M_manager;
    p_Stack_30 = this->fp[6]._M_invoker;
    this->fp[6]._M_invoker =
         std::
         _Function_handler<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzcreateapproxspace.cpp:568:23)>
         ::_M_invoke;
    if (local_38 != (_Manager_type)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
    local_28 = this->fhcurlfam;
    uStack_24 = 0;
    uStack_20 = 0;
    uStack_1c = 0;
    local_48._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&this->fp[7].super__Function_base._M_functor;
    local_48._8_8_ = *(undefined8 *)((long)&this->fp[7].super__Function_base._M_functor + 8);
    *(HCurlFamily *)&this->fp[7].super__Function_base._M_functor = local_28;
    *(undefined4 *)((long)&this->fp[7].super__Function_base._M_functor + 4) = 0;
    *(undefined4 *)((long)&this->fp[7].super__Function_base._M_functor + 8) = 0;
    *(undefined4 *)((long)&this->fp[7].super__Function_base._M_functor + 0xc) = 0;
    local_38 = this->fp[7].super__Function_base._M_manager;
    this->fp[7].super__Function_base._M_manager =
         std::
         _Function_handler<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzcreateapproxspace.cpp:569:21)>
         ::_M_manager;
    p_Stack_30 = this->fp[7]._M_invoker;
    this->fp[7]._M_invoker =
         std::
         _Function_handler<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzcreateapproxspace.cpp:569:21)>
         ::_M_invoke;
    if (local_38 != (_Manager_type)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
  }
  else {
    if (dimension == 2) {
      std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
                ((function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)> *)this->fp,CreateNoElement);
      local_28 = this->fhcurlfam;
      uStack_24 = 0;
      uStack_20 = 0;
      uStack_1c = 0;
      local_48._M_unused._0_8_ =
           (undefined8)*(undefined8 *)&this->fp[1].super__Function_base._M_functor;
      local_48._8_8_ = *(undefined8 *)((long)&this->fp[1].super__Function_base._M_functor + 8);
      *(HCurlFamily *)&this->fp[1].super__Function_base._M_functor = local_28;
      *(undefined4 *)((long)&this->fp[1].super__Function_base._M_functor + 4) = 0;
      *(undefined4 *)((long)&this->fp[1].super__Function_base._M_functor + 8) = 0;
      *(undefined4 *)((long)&this->fp[1].super__Function_base._M_functor + 0xc) = 0;
      local_38 = this->fp[1].super__Function_base._M_manager;
      this->fp[1].super__Function_base._M_manager =
           std::
           _Function_handler<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzcreateapproxspace.cpp:553:21)>
           ::_M_manager;
      p_Stack_30 = this->fp[1]._M_invoker;
      this->fp[1]._M_invoker =
           std::
           _Function_handler<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzcreateapproxspace.cpp:553:21)>
           ::_M_invoke;
      if (local_38 != (_Manager_type)0x0) {
        (*local_38)(&local_48,&local_48,__destroy_functor);
      }
      local_28 = this->fhcurlfam;
      uStack_24 = 0;
      uStack_20 = 0;
      uStack_1c = 0;
      local_48._M_unused._0_8_ =
           (undefined8)*(undefined8 *)&this->fp[2].super__Function_base._M_functor;
      local_48._8_8_ = *(undefined8 *)((long)&this->fp[2].super__Function_base._M_functor + 8);
      *(HCurlFamily *)&this->fp[2].super__Function_base._M_functor = local_28;
      *(undefined4 *)((long)&this->fp[2].super__Function_base._M_functor + 4) = 0;
      *(undefined4 *)((long)&this->fp[2].super__Function_base._M_functor + 8) = 0;
      *(undefined4 *)((long)&this->fp[2].super__Function_base._M_functor + 0xc) = 0;
      local_38 = this->fp[2].super__Function_base._M_manager;
      this->fp[2].super__Function_base._M_manager =
           std::
           _Function_handler<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzcreateapproxspace.cpp:554:25)>
           ::_M_manager;
      p_Stack_30 = this->fp[2]._M_invoker;
      this->fp[2]._M_invoker =
           std::
           _Function_handler<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzcreateapproxspace.cpp:554:25)>
           ::_M_invoke;
      if (local_38 != (_Manager_type)0x0) {
        (*local_38)(&local_48,&local_48,__destroy_functor);
      }
      local_28 = this->fhcurlfam;
      uStack_24 = 0;
      uStack_20 = 0;
      uStack_1c = 0;
      local_48._M_unused._0_8_ =
           (undefined8)*(undefined8 *)&this->fp[3].super__Function_base._M_functor;
      local_48._8_8_ = *(undefined8 *)((long)&this->fp[3].super__Function_base._M_functor + 8);
      *(HCurlFamily *)&this->fp[3].super__Function_base._M_functor = local_28;
      *(undefined4 *)((long)&this->fp[3].super__Function_base._M_functor + 4) = 0;
      *(undefined4 *)((long)&this->fp[3].super__Function_base._M_functor + 8) = 0;
      *(undefined4 *)((long)&this->fp[3].super__Function_base._M_functor + 0xc) = 0;
      local_38 = this->fp[3].super__Function_base._M_manager;
      this->fp[3].super__Function_base._M_manager =
           std::
           _Function_handler<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzcreateapproxspace.cpp:555:30)>
           ::_M_manager;
      p_Stack_30 = this->fp[3]._M_invoker;
      this->fp[3]._M_invoker =
           std::
           _Function_handler<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzcreateapproxspace.cpp:555:30)>
           ::_M_invoke;
      if (local_38 != (_Manager_type)0x0) {
        (*local_38)(&local_48,&local_48,__destroy_functor);
      }
    }
    else {
      if (dimension != 1) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzcreateapproxspace.cpp"
                   ,0x23c);
      }
      std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
                ((function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)> *)this->fp,CreateHCurlBoundPointEl);
      local_28 = this->fhcurlfam;
      uStack_24 = 0;
      uStack_20 = 0;
      uStack_1c = 0;
      local_48._M_unused._0_8_ =
           (undefined8)*(undefined8 *)&this->fp[1].super__Function_base._M_functor;
      local_48._8_8_ = *(undefined8 *)((long)&this->fp[1].super__Function_base._M_functor + 8);
      *(HCurlFamily *)&this->fp[1].super__Function_base._M_functor = local_28;
      *(undefined4 *)((long)&this->fp[1].super__Function_base._M_functor + 4) = 0;
      *(undefined4 *)((long)&this->fp[1].super__Function_base._M_functor + 8) = 0;
      *(undefined4 *)((long)&this->fp[1].super__Function_base._M_functor + 0xc) = 0;
      local_38 = this->fp[1].super__Function_base._M_manager;
      this->fp[1].super__Function_base._M_manager =
           std::
           _Function_handler<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzcreateapproxspace.cpp:543:21)>
           ::_M_manager;
      p_Stack_30 = this->fp[1]._M_invoker;
      this->fp[1]._M_invoker =
           std::
           _Function_handler<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzcreateapproxspace.cpp:543:21)>
           ::_M_invoke;
      if (local_38 != (_Manager_type)0x0) {
        (*local_38)(&local_48,&local_48,__destroy_functor);
      }
      std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
                ((function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)> *)(this->fp + 2),CreateNoElement);
      std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
                ((function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)> *)(this->fp + 3),CreateNoElement);
    }
    std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
              ((function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)> *)(this->fp + 4),CreateNoElement);
    std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
              ((function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)> *)(this->fp + 5),CreateNoElement);
    std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
              ((function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)> *)(this->fp + 6),CreateNoElement);
    std::function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)>::operator=
              ((function<TPZCompEl*(TPZGeoEl*,TPZCompMesh&)> *)(this->fp + 7),CreateNoElement);
  }
  return;
}

Assistant:

void TPZCreateApproximationSpace::SetAllCreateFunctionsHCurl(int dimension){

    fStyle = EHCurl;
    const HCurlFamily &hcurlfam = this->fhcurlfam;

    switch (dimension) {
    case 1:
        fp[EPoint] = CreateHCurlBoundPointEl;
        fp[EOned] = [hcurlfam](TPZGeoEl *gel,TPZCompMesh &mesh) {return CreateHCurlLinearEl(gel,mesh,hcurlfam);};
        fp[ETriangle] = CreateNoElement;
        fp[EQuadrilateral] = CreateNoElement;
        fp[ETetraedro] = CreateNoElement;
        fp[EPiramide] = CreateNoElement;
        fp[EPrisma] = CreateNoElement;
        fp[ECube] = CreateNoElement;
        break;
    case 2:
        fp[EPoint] = CreateNoElement;
        fp[EOned] = [hcurlfam](TPZGeoEl *gel,TPZCompMesh &mesh) {return CreateHCurlBoundLinearEl(gel,mesh,hcurlfam);};
        fp[ETriangle] = [hcurlfam](TPZGeoEl *gel,TPZCompMesh &mesh) {return CreateHCurlTriangleEl(gel,mesh,hcurlfam);};
        fp[EQuadrilateral] = [hcurlfam](TPZGeoEl *gel,TPZCompMesh &mesh) {return CreateHCurlQuadEl(gel,mesh,hcurlfam);};
        fp[ETetraedro] = CreateNoElement;
        fp[EPiramide] = CreateNoElement;
        fp[EPrisma] = CreateNoElement;
        fp[ECube] = CreateNoElement;
        break;
    case 3:
        fp[EPoint] = CreateNoElement;
        fp[EOned] = CreateNoElement;
        fp[ETriangle] = [hcurlfam](TPZGeoEl *gel,TPZCompMesh &mesh) {return CreateHCurlTriangleEl(gel,mesh,hcurlfam);};
        fp[EQuadrilateral] = [hcurlfam](TPZGeoEl *gel,TPZCompMesh &mesh) {return CreateHCurlBoundQuadEl(gel,mesh,hcurlfam);};
        fp[ETetraedro] = [hcurlfam](TPZGeoEl *gel,TPZCompMesh &mesh) {return CreateHCurlTetraEl(gel,mesh,hcurlfam);};
        fp[EPiramide] = CreateHCurlPyramEl;
        fp[EPrisma] = [hcurlfam](TPZGeoEl *gel,TPZCompMesh &mesh) {return CreateHCurlPrismEl(gel,mesh,hcurlfam);};
        fp[ECube] = [hcurlfam](TPZGeoEl *gel,TPZCompMesh &mesh) {return CreateHCurlCubeEl(gel,mesh,hcurlfam);};
        break;
    default:
        DebugStop();
        break;
    }
    
}